

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O0

void __thiscall
V2DCFilter::renderStereo(V2DCFilter *this,StereoSample *dest,StereoSample *src,int nsamples)

{
  float R_00;
  float fVar1;
  int local_3c;
  V2DCF VStack_38;
  int i;
  V2DCF r;
  V2DCF l;
  float R;
  int nsamples_local;
  StereoSample *src_local;
  StereoSample *dest_local;
  V2DCFilter *this_local;
  
  R_00 = this->inst->SRfcdcfilter;
  r = this->fl;
  VStack_38 = this->fr;
  for (local_3c = 0; local_3c < nsamples; local_3c = local_3c + 1) {
    fVar1 = V2DCF::step(&r,src[local_3c].field_0.l,R_00);
    dest[local_3c].field_0.l = fVar1;
    fVar1 = V2DCF::step(&stack0xffffffffffffffc8,*(float *)((long)src + (long)local_3c * 8 + 4),R_00
                       );
    *(float *)((long)dest + (long)local_3c * 8 + 4) = fVar1;
  }
  this->fl = r;
  this->fr = VStack_38;
  return;
}

Assistant:

void renderStereo(StereoSample *dest, const StereoSample *src, int nsamples)
    {
        float R = inst->SRfcdcfilter;

        V2DCF l = fl;
        V2DCF r = fr;
        for (int i=0; i < nsamples; i++)
        {
            dest[i].l = l.step(src[i].l, R);
            dest[i].r = r.step(src[i].r, R);
        }
        fl = l;
        fr = r;
    }